

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O0

void jinit_huff_encoder(j_compress_ptr cinfo)

{
  undefined8 *puVar1;
  long in_RDI;
  int i;
  huff_entropy_ptr entropy;
  int local_14;
  
  puVar1 = (undefined8 *)(*(code *)**(undefined8 **)(in_RDI + 8))(in_RDI,1,0xf8);
  *(undefined8 **)(in_RDI + 0x230) = puVar1;
  *puVar1 = start_pass_huff;
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    puVar1[(long)local_14 + 0xc] = 0;
    puVar1[(long)local_14 + 8] = 0;
    puVar1[(long)local_14 + 0x14] = 0;
    puVar1[(long)local_14 + 0x10] = 0;
  }
  if (*(int *)(in_RDI + 0x158) != 0) {
    puVar1[0x1e] = 0;
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_huff_encoder (j_compress_ptr cinfo)
{
  huff_entropy_ptr entropy;
  int i;

  entropy = (huff_entropy_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				SIZEOF(huff_entropy_encoder));
  cinfo->entropy = (struct jpeg_entropy_encoder *) entropy;
  entropy->pub.start_pass = start_pass_huff;

  /* Mark tables unallocated */
  for (i = 0; i < NUM_HUFF_TBLS; i++) {
    entropy->dc_derived_tbls[i] = entropy->ac_derived_tbls[i] = NULL;
    entropy->dc_count_ptrs[i] = entropy->ac_count_ptrs[i] = NULL;
  }

  if (cinfo->progressive_mode)
    entropy->bit_buffer = NULL;	/* needed only in AC refinement scan */
}